

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportBuildFileGenerator::GetFileSetFiles_abi_cxx11_
          (string *__return_storage_ptr__,cmExportBuildFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *param_3)

{
  cmMakefile *this_00;
  _Base_ptr p_Var1;
  pointer pbVar2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ostream *poVar7;
  string *psVar8;
  _Rb_tree_node_base *p_Var9;
  cmLocalGenerator *lg;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer cge;
  _Base_ptr p_Var10;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view str;
  string_view separator;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  char local_2ca [2];
  string *local_2c8;
  cmGeneratorTarget *local_2c0;
  cmLocalGenerator *local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  string local_1c8;
  ostringstream e;
  
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resultVector.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8 = __return_storage_ptr__;
  local_2c0 = gte;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,gte->Makefile,IncludeEmptyConfig);
  cmFileSet::CompileFileEntries(&fileEntries,fileSet);
  cmFileSet::CompileDirectoryEntries(&directoryEntries,fileSet);
  pbVar2 = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  paVar6 = &local_2c8->field_2;
  lg = (cmLocalGenerator *)
       configs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (lg == (cmLocalGenerator *)pbVar2) goto LAB_00311345;
    local_2b8 = lg;
    cmFileSet::EvaluateDirectoryEntries
              (&directories,fileSet,&directoryEntries,local_2c0->LocalGenerator,(string *)lg,
               local_2c0,(cmGeneratorExpressionDAGChecker *)0x0);
    puVar3 = fileEntries.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &files._M_t._M_impl.super__Rb_tree_header._M_header;
    files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (cge = fileEntries.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; cge != puVar3; cge = cge + 1) {
      lg = local_2c0->LocalGenerator;
      cmFileSet::EvaluateFileEntry
                (fileSet,&directories,&files,cge,lg,(string *)local_2b8,local_2c0,
                 (cmGeneratorExpressionDAGChecker *)0x0);
    }
    bVar4 = std::
            any_of<__gnu_cxx::__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>*,std::vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>>,bool(*)(std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>const&)>
                      ((__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                        )directoryEntries.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                        )directoryEntries.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                       anon_unknown.dwarf_ea9180::EntryIsContextSensitive);
    if ((bVar4) ||
       (bVar4 = std::
                any_of<__gnu_cxx::__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>*,std::vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>>,bool(*)(std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>const&)>
                          ((__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                            )fileEntries.
                             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                            )fileEntries.
                             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                           anon_unknown.dwarf_ea9180::EntryIsContextSensitive), bVar4)) {
      __y._M_str = "CXX_MODULES";
      __y._M_len = 0xb;
      __x._M_str = (fileSet->Type)._M_dataplus._M_p;
      __x._M_len = (fileSet->Type)._M_string_length;
      bVar5 = std::operator==(__x,__y);
      bVar4 = true;
      p_Var9 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (!bVar5) goto LAB_00311212;
      this_00 = this->LG->Makefile;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar7 = std::operator<<((ostream *)&e,"The \"");
      psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(local_2c0);
      poVar7 = std::operator<<(poVar7,(string *)psVar8);
      poVar7 = std::operator<<(poVar7,"\" target\'s interface file set \"");
      poVar7 = std::operator<<(poVar7,(string *)&fileSet->Name);
      poVar7 = std::operator<<(poVar7,"\" of type \"");
      poVar7 = std::operator<<(poVar7,(string *)&fileSet->Type);
      std::operator<<(poVar7,"\" contains context-sensitive file entries which is not supported.");
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      (local_2c8->_M_dataplus)._M_p = (pointer)paVar6;
      local_2c8->_M_string_length = 0;
      (local_2c8->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar4 = false;
      bVar5 = false;
    }
    else {
      bVar4 = false;
      p_Var9 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_00311212:
      for (; (_Rb_tree_header *)p_Var9 != &files._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        p_Var1 = p_Var9[2]._M_parent;
        for (p_Var10 = *(_Base_ptr *)(p_Var9 + 2); p_Var10 != p_Var1; p_Var10 = p_Var10 + 1) {
          str._M_str = (char *)0x1;
          str._M_len = *(size_t *)p_Var10;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    ((string *)&e,(cmOutputConverter *)p_Var10->_M_parent,str,(WrapQuotes)lg);
          if ((bVar4) &&
             ((long)configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
            lg = (cmLocalGenerator *)&e;
            cmStrCat<char_const(&)[13],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                      (&local_1c8,(char (*) [13])"\"$<$<CONFIG:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b8,(char (*) [3])">:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                       (char (*) [3])">\"");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &resultVector,&local_1c8);
          }
          else {
            local_2ca[1] = 0x22;
            local_2ca[0] = '\"';
            cmStrCat<char,std::__cxx11::string&,char>
                      (&local_1c8,local_2ca + 1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                       local_2ca);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &resultVector,&local_1c8);
          }
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&e);
        }
      }
      if (bVar4) {
        bVar5 = (long)configs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)configs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x20;
        bVar4 = !bVar5;
      }
      else {
        bVar5 = true;
        bVar4 = false;
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&files._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&directories);
    lg = (cmLocalGenerator *)&(local_2b8->super_cmOutputConverter).LinkScriptShell;
  } while (bVar4);
  if (bVar5) {
LAB_00311345:
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(local_2c8,&resultVector,separator,(string_view)ZEXT816(0));
  }
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&directoryEntries);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&fileEntries);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&resultVector);
  return local_2c8;
}

Assistant:

std::string cmExportBuildFileGenerator::GetFileSetFiles(cmGeneratorTarget* gte,
                                                        cmFileSet* fileSet,
                                                        cmTargetExport* /*te*/)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  auto fileEntries = fileSet->CompileFileEntries();
  auto directoryEntries = fileSet->CompileDirectoryEntries();

  for (auto const& config : configs) {
    auto directories = fileSet->EvaluateDirectoryEntries(
      directoryEntries, gte->LocalGenerator, config, gte);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      fileSet->EvaluateFileEntry(directories, files, entry,
                                 gte->LocalGenerator, config, gte);
    }

    bool const contextSensitive =
      std::any_of(directoryEntries.begin(), directoryEntries.end(),
                  EntryIsContextSensitive) ||
      std::any_of(fileEntries.begin(), fileEntries.end(),
                  EntryIsContextSensitive);

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (contextSensitive && type == "CXX_MODULES"_s) {
      auto* mf = this->LG->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    for (auto const& it : files) {
      for (auto const& filename : it.second) {
        auto escapedFile = cmOutputConverter::EscapeForCMake(
          filename, cmOutputConverter::WrapQuotes::NoWrap);
        if (contextSensitive && configs.size() != 1) {
          resultVector.push_back(
            cmStrCat("\"$<$<CONFIG:", config, ">:", escapedFile, ">\""));
        } else {
          resultVector.emplace_back(cmStrCat('"', escapedFile, '"'));
        }
      }
    }

    if (!(contextSensitive && configs.size() != 1)) {
      break;
    }
  }

  return cmJoin(resultVector, " ");
}